

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CreateTriangle
          (SACSubcaseBase *this,GLuint *vao,GLuint *vbo,GLuint *ebo)

{
  CallLogWrapper *this_00;
  float v [33];
  undefined1 local_a8 [136];
  
  if ((vao != (GLuint *)0x0) && (vbo != (GLuint *)0x0)) {
    memcpy(local_a8,&DAT_01a69610,0x84);
    this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
    glu::CallLogWrapper::glGenBuffers(this_00,1,vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*vbo);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x84,local_a8,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,*vao);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*vbo);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0x2c,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,3,0x1406,'\0',0x2c,(void *)0x8);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,2,3,0x1406,'\0',0x2c,(void *)0x14);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,3,3,0x1406,'\0',0x2c,(void *)0x20);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,3);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    return;
  }
  __assert_fail("vao && vbo",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderAtomicCountersTests.cpp"
                ,0x120,
                "void gl4cts::(anonymous namespace)::SACSubcaseBase::CreateTriangle(GLuint *, GLuint *, GLuint *)"
               );
}

Assistant:

void CreateTriangle(GLuint* vao, GLuint* vbo, GLuint* ebo)
	{
		assert(vao && vbo);

		// interleaved data (vertex, color0 (green), color1 (blue), color2 (red))
		const float v[] = {
			-1.0f, -1.0f, 0.0f, 1.0f, 0.0f, 0.0f,  0.0f, 1.0f, 1.0f, 0.0f, 0.0f, 3.0f, -1.0f, 0.0f, 1.0f, 0.0f, 0.0f,
			0.0f,  1.0f,  1.0f, 0.0f, 0.0f, -1.0f, 3.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f, 1.0f,  1.0f, 0.0f, 0.0f,
		};
		glGenBuffers(1, vbo);
		glBindBuffer(GL_ARRAY_BUFFER, *vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(v), v, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		if (ebo)
		{
			std::vector<GLushort> index_data(3);
			for (int i = 0; i < 3; ++i)
			{
				index_data[i] = static_cast<GLushort>(i);
			}
			glGenBuffers(1, ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, *ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(GLushort) * 4, &index_data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, vao);
		glBindVertexArray(*vao);
		glBindBuffer(GL_ARRAY_BUFFER, *vbo);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, sizeof(float) * 11, 0);
		glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 11, reinterpret_cast<void*>(sizeof(float) * 2));
		glVertexAttribPointer(2, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 11, reinterpret_cast<void*>(sizeof(float) * 5));
		glVertexAttribPointer(3, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 11, reinterpret_cast<void*>(sizeof(float) * 8));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(3);
		if (ebo)
		{
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, *ebo);
		}
		glBindVertexArray(0);
	}